

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

bool mpt::assign<mpt::iterator*>(iterator **from,int type,void *ptr)

{
  int iVar1;
  void *ptr_local;
  int type_local;
  iterator **from_local;
  
  if ((0 < type) && (iVar1 = type_properties<mpt::iterator_*>::id(true), type == iVar1)) {
    if (ptr != (void *)0x0) {
      *(iterator **)ptr = *from;
    }
    return true;
  }
  return false;
}

Assistant:

bool assign(const T &from, int type, void *ptr) {
	/* bad arg or type ID registration error */
	if (type <= 0 || type != type_properties<T>::id(true)) {
		return false;
	}
	if (ptr) {
		*static_cast<T *>(ptr) = from;
	}
	return true;
}